

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer_world.cpp
# Opt level: O0

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
* __thiscall
RandomizerWorld::item_names_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
           *__return_storage_ptr__,RandomizerWorld *this,bool strict)

{
  byte bVar1;
  Item *this_00;
  string *__k;
  byte *pbVar2;
  mapped_type *pmVar3;
  allocator<char> local_111;
  key_type local_110;
  allocator<char> local_e9;
  key_type local_e8;
  allocator<char> local_c1;
  key_type local_c0;
  allocator<char> local_99;
  key_type local_98 [3];
  out_of_range *anon_var_0;
  byte local_1b;
  undefined1 local_1a;
  byte local_19;
  uint8_t i;
  RandomizerWorld *pRStack_18;
  bool strict_local;
  RandomizerWorld *this_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
  *item_names;
  
  local_1a = 0;
  local_19 = strict;
  pRStack_18 = this;
  this_local = (RandomizerWorld *)__return_storage_ptr__;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
  ::map(__return_storage_ptr__);
  for (local_1b = 0; bVar1 = local_1b, local_1b < 0x45; local_1b = local_1b + 1) {
    this_00 = World::item(&this->super_World,local_1b);
    __k = Item::name_abi_cxx11_(this_00);
    pbVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
             ::operator[](__return_storage_ptr__,__k);
    *pbVar2 = bVar1;
  }
  if ((local_19 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_98,"Kazalt Jewel",&local_99);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
             ::operator[](__return_storage_ptr__,local_98);
    *pmVar3 = '(';
    std::__cxx11::string::~string((string *)local_98);
    std::allocator<char>::~allocator(&local_99);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"Yellow Jewel",&local_c1)
    ;
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
             ::operator[](__return_storage_ptr__,&local_c0);
    *pmVar3 = '\"';
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"Blue Jewel",&local_e9);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
             ::operator[](__return_storage_ptr__,&local_e8);
    *pmVar3 = '!';
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"Green Jewel",&local_111);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
             ::operator[](__return_storage_ptr__,&local_110);
    *pmVar3 = '4';
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_111);
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, uint8_t> RandomizerWorld::item_names(bool strict) const
{
    // Add factual item names from the world data
    std::map<std::string, uint8_t> item_names;
    for(uint8_t i=0 ; i<ITEM_COUNT ; ++i)
    {
        try
        {
            item_names[this->item(i)->name()] = i;
        }
        catch(std::out_of_range&)
        {
            item_names["No" + std::to_string(i)] = i;
        }
    }

    // Add alternative names which depend on settings unless we are in "strict" mode
    if(!strict)
    {
        item_names["Kazalt Jewel"] = ITEM_RED_JEWEL;
        item_names["Yellow Jewel"] = ITEM_YELLOW_JEWEL;
        item_names["Blue Jewel"] = ITEM_BLUE_JEWEL;
        item_names["Green Jewel"] = ITEM_GREEN_JEWEL;
    }

    return item_names;
}